

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  undefined1 local_88 [8];
  Mem t;
  sqlite3_context ctx;
  FuncDef *pFunc_local;
  Mem *pMem_local;
  
  memset(&t.xDel,0,0x38);
  memset(local_88,0,0x38);
  t.u.i._0_2_ = 1;
  t._32_8_ = pMem->db;
  t.xDel = (_func_void_void_ptr *)local_88;
  (*pFunc->xFinalize)((sqlite3_context *)&t.xDel);
  if (0 < pMem->szMalloc) {
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  memcpy(pMem,local_88,0x38);
  return ctx.pVdbe._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  sqlite3_context ctx;
  Mem t;
  assert( pFunc!=0 );
  assert( pFunc->xFinalize!=0 );
  assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  memset(&ctx, 0, sizeof(ctx));
  memset(&t, 0, sizeof(t));
  t.flags = MEM_Null;
  t.db = pMem->db;
  ctx.pOut = &t;
  ctx.pMem = pMem;
  ctx.pFunc = pFunc;
  pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
  assert( (pMem->flags & MEM_Dyn)==0 );
  if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
  memcpy(pMem, &t, sizeof(t));
  return ctx.isError;
}